

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool __thiscall
tinyxml2::XMLPrinter::VisitEnter(XMLPrinter *this,XMLElement *element,XMLAttribute *attribute)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  char *value;
  undefined1 compactMode;
  
  pXVar1 = (element->super_XMLNode)._parent;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[6])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xb])(this);
      compactMode = (undefined1)iVar2;
      goto LAB_001338b7;
    }
  }
  compactMode = this->_compactMode;
LAB_001338b7:
  iVar2 = (*(element->super_XMLNode)._vptr_XMLNode[9])(element);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    pcVar3 = StrPair::GetStr(&(element->super_XMLNode)._value);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  OpenElement(this,pcVar3,(bool)compactMode);
  for (; attribute != (XMLAttribute *)0x0; attribute = attribute->_next) {
    pcVar3 = StrPair::GetStr(&attribute->_name);
    value = StrPair::GetStr(&attribute->_value);
    PushAttribute(this,pcVar3,value);
  }
  return true;
}

Assistant:

bool XMLPrinter::VisitEnter( const XMLElement& element, const XMLAttribute* attribute )
{
    const XMLElement* parentElem = 0;
    if ( element.Parent() ) {
        parentElem = element.Parent()->ToElement();
    }
    const bool compactMode = parentElem ? CompactMode( *parentElem ) : _compactMode;
    OpenElement( element.Name(), compactMode );
    while ( attribute ) {
        PushAttribute( attribute->Name(), attribute->Value() );
        attribute = attribute->Next();
    }
    return true;
}